

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginFverb.cpp
# Opt level: O1

void __thiscall PluginFverb::initParameter(PluginFverb *this,uint32_t index,Parameter *parameter)

{
  bool bVar1;
  char *pcVar2;
  ParameterRange *pPVar3;
  undefined8 uVar4;
  uint index_00;
  int __fd;
  
  if (index < 0xf) {
    if ((int)index < 0xd) {
      if (index == 0) {
        DISTRHO::Parameter::initDesignation(parameter,kParameterDesignationBypass);
        return;
      }
      if (index == 0xc) {
        parameter->hints = 1;
        DISTRHO::String::_dup(&parameter->name,0x10b6fe);
        __fd = 0x10b702;
LAB_00105bf3:
        DISTRHO::String::_dup(&parameter->symbol,__fd);
        (parameter->ranges).def = 0.0;
        (parameter->ranges).min = 0.0;
        (parameter->ranges).max = 100.0;
        DISTRHO::String::_dup(&parameter->unit,0x10b706);
        return;
      }
    }
    else {
      if (index == 0xd) {
        parameter->hints = 1;
        DISTRHO::String::_dup(&parameter->name,0x10b708);
        __fd = 0x10b70c;
        goto LAB_00105bf3;
      }
      if (index == 0xe) {
        parameter->hints = 1;
        DISTRHO::String::_dup(&parameter->name,0x10b710);
        DISTRHO::String::_dup(&parameter->symbol,0x10b718);
        *(byte *)&parameter->hints = (byte)parameter->hints | 6;
        (parameter->ranges).def = 0.0;
        (parameter->ranges).min = 0.0;
        (parameter->ranges).max = 1.0;
        return;
      }
    }
    index_00 = index - 1;
    if (index_00 < 0xb) {
      parameter->hints = 1;
      pcVar2 = Fverb::parameter_label(index_00);
      DISTRHO::String::_dup(&parameter->name,(int)pcVar2);
      pcVar2 = Fverb::parameter_short_label(index_00);
      DISTRHO::String::_dup(&parameter->shortName,(int)pcVar2);
      pcVar2 = Fverb::parameter_symbol(index_00);
      DISTRHO::String::_dup(&parameter->symbol,(int)pcVar2);
      pcVar2 = Fverb::parameter_unit(index_00);
      DISTRHO::String::_dup(&parameter->unit,(int)pcVar2);
      pPVar3 = Fverb::parameter_range(index_00);
      (parameter->ranges).def = pPVar3->init;
      (parameter->ranges).min = pPVar3->min;
      (parameter->ranges).max = pPVar3->max;
      bVar1 = Fverb::parameter_is_trigger(index_00);
      if (bVar1) {
        *(byte *)&parameter->hints = (byte)parameter->hints | 0x22;
      }
      bVar1 = Fverb::parameter_is_boolean(index_00);
      if (bVar1) {
        *(byte *)&parameter->hints = (byte)parameter->hints | 6;
      }
      bVar1 = Fverb::parameter_is_integer(index_00);
      if (bVar1) {
        *(byte *)&parameter->hints = (byte)parameter->hints | 4;
      }
      bVar1 = Fverb::parameter_is_logarithmic(index_00);
      if (bVar1) {
        *(byte *)&parameter->hints = (byte)parameter->hints | 8;
      }
      return;
    }
    pcVar2 = "index >= pIdDspFirst && index <= pIdDspLast";
    uVar4 = 0x5e;
  }
  else {
    pcVar2 = "index < kNumParameters";
    uVar4 = 0x3b;
  }
  d_stderr2("assertion failure: \"%s\" in file %s, line %i",pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]fverb/plugins/fverb/PluginFverb.cpp"
            ,uVar4);
  return;
}

Assistant:

void PluginFverb::initParameter(uint32_t index, Parameter &parameter)
{
    DISTRHO_SAFE_ASSERT_RETURN(index < kNumParameters, );

    switch (index) {
    case pIdBypass:
        parameter.initDesignation(kParameterDesignationBypass);
        return;
    case pIdDry:
        parameter.hints = kParameterIsAutomatable;
        parameter.name = "Dry";
        parameter.symbol = "dry";
        parameter.ranges.def = 0;
        parameter.ranges.min = 0;
        parameter.ranges.max = 100;
        parameter.unit = "%";
        return;
    case pIdWet:
        parameter.hints = kParameterIsAutomatable;
        parameter.name = "Wet";
        parameter.symbol = "wet";
        parameter.ranges.def = 0;
        parameter.ranges.min = 0;
        parameter.ranges.max = 100;
        parameter.unit = "%";
        return;
    case pIdVintage:
        parameter.hints = kParameterIsAutomatable;
        parameter.name = "Vintage";
        parameter.symbol = "vintage";
        parameter.hints |= kParameterIsBoolean|kParameterIsInteger;
        parameter.ranges.def = 0;
        parameter.ranges.min = 0;
        parameter.ranges.max = 1;
        return;
    }

    DISTRHO_SAFE_ASSERT_RETURN(index >= pIdDspFirst && index <= pIdDspLast, );
    index -= pIdDspFirst;

    parameter.hints = kParameterIsAutomatable;

    parameter.name = Fverb::parameter_label(index);
    parameter.shortName = Fverb::parameter_short_label(index);
    parameter.symbol = Fverb::parameter_symbol(index);
    parameter.unit = Fverb::parameter_unit(index);

    const Fverb::ParameterRange &range = *Fverb::parameter_range(index);
    parameter.ranges.def = range.init;
    parameter.ranges.min = range.min;
    parameter.ranges.max = range.max;

    if (Fverb::parameter_is_trigger(index))
        parameter.hints |= kParameterIsTrigger;
    if (Fverb::parameter_is_boolean(index))
        parameter.hints |= kParameterIsBoolean|kParameterIsInteger;
    if (Fverb::parameter_is_integer(index))
        parameter.hints |= kParameterIsInteger;
    if (Fverb::parameter_is_logarithmic(index))
        parameter.hints |= kParameterIsLogarithmic;
}